

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_language.cpp
# Opt level: O0

ostream * Omega_h::operator<<(ostream *os,Language *lang)

{
  bool bVar1;
  bool bVar2;
  reference pTVar3;
  size_type sVar4;
  ostream *poVar5;
  reference pcVar6;
  reference pPVar7;
  reference __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *symb;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  Production *prod_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_> *__range2_1;
  bool first;
  char *c;
  iterator __end2;
  iterator __begin2;
  __string_type *__range2;
  __string_type lead;
  stringstream local_268 [8];
  stringstream ss;
  ostream local_258 [376];
  string *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *nonterminal;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  Production *prod;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_> *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nonterminal_list;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nonterminal_set;
  Token *token;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_> *__range1;
  Language *lang_local;
  ostream *os_local;
  
  __end1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::begin
                     (&lang->tokens);
  token = (Token *)std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
                   ::end(&lang->tokens);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Omega_h::Language::Token_*,_std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>_>
                                     *)&token), bVar1) {
    pTVar3 = __gnu_cxx::
             __normal_iterator<const_Omega_h::Language::Token_*,_std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>_>
             ::operator*(&__end1);
    poVar5 = std::operator<<(os,"token ");
    poVar5 = std::operator<<(poVar5,(string *)pTVar3);
    poVar5 = std::operator<<(poVar5," regex \'");
    poVar5 = std::operator<<(poVar5,(string *)&pTVar3->regex);
    std::operator<<(poVar5,"\'\n");
    __gnu_cxx::
    __normal_iterator<const_Omega_h::Language::Token_*,_std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>_>
    ::operator++(&__end1);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&nonterminal_list.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1_1);
  __end1_1 = std::
             vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
             begin(&lang->productions);
  prod = (Production *)
         std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
         ::end(&lang->productions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_Omega_h::Language::Production_*,_std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>_>
                             *)&prod), bVar1) {
    pPVar7 = __gnu_cxx::
             __normal_iterator<const_Omega_h::Language::Production_*,_std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>_>
             ::operator*(&__end1_1);
    sVar4 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&nonterminal_list.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&pPVar7->lhs);
    if (sVar4 == 0) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&nonterminal_list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,&pPVar7->lhs);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1_1,&pPVar7->lhs);
    }
    __gnu_cxx::
    __normal_iterator<const_Omega_h::Language::Production_*,_std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1_1);
  nonterminal = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range1_1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&nonterminal), bVar1) {
    local_e0 = (string *)
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1_2);
    std::__cxx11::stringstream::stringstream(local_268);
    poVar5 = std::operator<<(local_258,local_e0);
    std::operator<<(poVar5," ::=");
    std::__cxx11::stringstream::str();
    std::operator<<(os,(string *)&__range2);
    __end2._M_current = (char *)std::__cxx11::string::begin();
    c = (char *)std::__cxx11::string::end();
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&c), bVar1) {
      pcVar6 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      *pcVar6 = ' ';
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    bVar1 = true;
    __end2_1 = std::
               vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
               ::begin(&lang->productions);
    prod_1 = (Production *)
             std::
             vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>::
             end(&lang->productions);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_Omega_h::Language::Production_*,_std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>_>
                               *)&prod_1), bVar2) {
      pPVar7 = __gnu_cxx::
               __normal_iterator<const_Omega_h::Language::Production_*,_std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>_>
               ::operator*(&__end2_1);
      bVar2 = std::operator!=(&pPVar7->lhs,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_e0);
      if (!bVar2) {
        if (bVar1) {
          bVar1 = false;
        }
        else {
          poVar5 = std::operator<<(os," |\n");
          std::operator<<(poVar5,(string *)&__range2);
        }
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&pPVar7->rhs);
        symb = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&pPVar7->rhs);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&symb), bVar2) {
          __lhs = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end3);
          bVar2 = std::operator==(__lhs,"|");
          if (bVar2) {
            std::operator<<(os," \'|\'");
          }
          else {
            poVar5 = std::operator<<(os," ");
            std::operator<<(poVar5,(string *)__lhs);
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_Omega_h::Language::Production_*,_std::vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>_>
      ::operator++(&__end2_1);
    }
    std::operator<<(os,"\n");
    std::__cxx11::string::~string((string *)&__range2);
    std::__cxx11::stringstream::~stringstream(local_268);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_2);
  }
  std::operator<<(os,"\n");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1_1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&nonterminal_list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Language const& lang) {
  for (auto& token : lang.tokens) {
    os << "token " << token.name << " regex \'" << token.regex << "\'\n";
  }
  std::set<std::string> nonterminal_set;
  std::vector<std::string> nonterminal_list;
  for (auto& prod : lang.productions) {
    if (!nonterminal_set.count(prod.lhs)) {
      nonterminal_set.insert(prod.lhs);
      nonterminal_list.push_back(prod.lhs);
    }
  }
  for (auto& nonterminal : nonterminal_list) {
    std::stringstream ss;
    ss << nonterminal << " ::=";
    auto lead = ss.str();
    os << lead;
    for (auto& c : lead) c = ' ';
    bool first = true;
    for (auto& prod : lang.productions) {
      if (prod.lhs != nonterminal) continue;
      if (first)
        first = false;
      else
        os << " |\n" << lead;
      for (auto& symb : prod.rhs) {
        if (symb == "|")
          os << " '|'";
        else
          os << " " << symb;
      }
    }
    os << "\n";
  }
  os << "\n";
  return os;
}